

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_IncorrectConstructionDuplicateExcludes_Test::TestBody
          (TApp_IncorrectConstructionDuplicateExcludes_Test *this)

{
  bool bVar1;
  Option *pOVar2;
  AssertHelper local_108;
  Message local_100 [2];
  OptionAlreadyAdded *anon_var_0;
  char *pcStack_e8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_d8;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  Option *local_80;
  Option *other;
  string local_70;
  allocator local_39;
  string local_38;
  Option *local_18;
  Option *cat;
  TApp_IncorrectConstructionDuplicateExcludes_Test *this_local;
  
  cat = (Option *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"--cat",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)((long)&other + 7));
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&other + 7));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"--other",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"",&local_c9);
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_a0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_80 = pOVar2;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CLI::Option::excludes(local_18,local_80);
    }
    testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff18,"");
    bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                      ((ConstCharPtr *)&stack0xffffffffffffff18);
    if (bVar1) {
      anon_var_0._7_1_ = 0;
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        CLI::Option::excludes(local_18,local_80);
      }
      if ((anon_var_0._7_1_ & 1) != 0) {
        return;
      }
      pcStack_e8 = 
      "Expected: cat->excludes(other) throws an exception of type CLI::OptionAlreadyAdded.\n  Actual: it throws nothing."
      ;
    }
    testing::Message::Message(local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xc2,pcStack_e8);
    testing::internal::AssertHelper::operator=(&local_108,local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(local_100);
  }
  else {
    testing::Message::Message(&local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xc1,
               "Expected: cat->excludes(other) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_d8);
  }
  return;
}

Assistant:

TEST_F(TApp, IncorrectConstructionDuplicateExcludes) {
    auto cat = app.add_flag("--cat");
    auto other = app.add_flag("--other");
    ASSERT_NO_THROW(cat->excludes(other));
    EXPECT_THROW(cat->excludes(other), CLI::OptionAlreadyAdded);
}